

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcDar.c
# Opt level: O1

int Abc_NtkDarBmcInter_int(Aig_Man_t *pMan,Inter_ManParams_t *pPars,Aig_Man_t **ppNtkRes)

{
  Aig_Obj_t *pObj;
  int iVar1;
  uint uVar2;
  Aig_Man_t *pAVar3;
  Abc_Cex_t *pAVar4;
  long lVar5;
  long lVar6;
  char *format;
  int iVar7;
  Aig_Man_t *pAVar8;
  ulong uVar9;
  int local_5c;
  uint local_58;
  int iFrame;
  long local_50;
  timespec ts;
  
  pAVar8 = (Aig_Man_t *)0x3;
  iVar1 = clock_gettime(3,(timespec *)&ts);
  if (iVar1 < 0) {
    lVar5 = 1;
  }
  else {
    lVar5 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(ts.tv_nsec),8);
    lVar5 = ((lVar5 >> 7) - (lVar5 >> 0x3f)) + ts.tv_sec * -1000000;
  }
  if (pMan->nRegs < 1) {
    __assert_fail("pMan->nRegs > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abci/abcDar.c"
                  ,0x996,
                  "int Abc_NtkDarBmcInter_int(Aig_Man_t *, Inter_ManParams_t *, Aig_Man_t **)");
  }
  if (ppNtkRes != (Aig_Man_t **)0x0) {
    *ppNtkRes = (Aig_Man_t *)0x0;
  }
  if (pPars->fUseSeparate == 0) {
    pAVar8 = pMan;
    uVar2 = Inter_ManPerformInterpolation(pMan,pPars,&iFrame);
    iVar1 = (int)pAVar8;
    local_5c = 0;
  }
  else {
    uVar2 = 0xffffffff;
    local_50 = lVar5;
    if (pMan->nTruePos < 1) {
      local_5c = 0;
      local_58 = 0;
    }
    else {
      uVar9 = 0;
      local_58 = 0;
      local_5c = 0;
      do {
        if ((long)pMan->vCos->nSize <= (long)uVar9) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecPtr.h"
                        ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
        }
        pObj = (Aig_Obj_t *)pMan->vCos->pArray[uVar9];
        if (pMan->pConst1 != (Aig_Obj_t *)((ulong)pObj->pFanin0 & 0xfffffffffffffffe)) {
          iVar1 = (int)uVar9;
          if (pPars->fVerbose != 0) {
            Abc_Print((int)pAVar8,"Solving output %2d (out of %2d):\n",uVar9 & 0xffffffff);
          }
          pAVar3 = Aig_ManDupOneOutput(pMan,iVar1,1);
          pAVar8 = Aig_ManScl(pAVar3,1,1,0,-1,-1,0,0);
          Aig_ManStop(pAVar3);
          if (pAVar8->nRegs == 0) {
            pAVar8->pSeqModel = (Abc_Cex_t *)0x0;
            pAVar3 = pAVar8;
            uVar2 = Fra_FraigSat(pAVar8,(long)pPars->nBTLimit,0,0,0,0,0,0,0,0);
            iVar7 = (int)pAVar3;
            if ((int *)pAVar8->pData != (int *)0x0) {
              iVar7 = pMan->nRegs;
              pAVar4 = Abc_CexCreate(iVar7,pMan->nTruePis,(int *)pAVar8->pData,0,iVar1,1);
              pAVar8->pSeqModel = pAVar4;
            }
          }
          else {
            pAVar3 = pAVar8;
            uVar2 = Inter_ManPerformInterpolation(pAVar8,pPars,&iFrame);
            iVar7 = (int)pAVar3;
          }
          pAVar4 = pAVar8->pSeqModel;
          if (pAVar4 == (Abc_Cex_t *)0x0) {
            if (uVar2 == 1) {
              Aig_ObjPatchFanin0(pMan,pObj,(Aig_Obj_t *)((ulong)pMan->pConst1 ^ 1));
            }
            else {
              local_58 = local_58 + 1;
            }
            Aig_ManStop(pAVar8);
            Abc_Print((int)pAVar8,"Solving output %3d (out of %3d) using interpolation.\r",
                      uVar9 & 0xffffffff,(ulong)(uint)pMan->nTruePos);
          }
          else {
            if (pPars->fDropSatOuts == 0) {
              pMan->pSeqModel = pAVar4;
              pAVar8->pSeqModel = (Abc_Cex_t *)0x0;
              pAVar4->iPo = iVar1;
              Aig_ManStop(pAVar8);
              break;
            }
            Abc_Print(iVar7,
                      "Output %d proved SAT in frame %d (replacing by const 0 and continuing...)\n",
                      uVar9 & 0xffffffff,(ulong)(uint)pAVar4->iFrame);
            Aig_ObjPatchFanin0(pMan,pObj,(Aig_Obj_t *)((ulong)pMan->pConst1 ^ 1));
            Aig_ManStop(pAVar8);
            local_5c = local_5c + 1;
          }
        }
        uVar9 = uVar9 + 1;
      } while ((long)uVar9 < (long)pMan->nTruePos);
    }
    pAVar8 = pMan;
    Aig_ManCleanup(pMan);
    iVar1 = (int)pAVar8;
    if (pMan->pSeqModel == (Abc_Cex_t *)0x0) {
      Abc_Print(iVar1,"Interpolation left %d (out of %d) outputs unsolved              \n",
                (ulong)local_58);
      uVar2 = uVar2 | -(uint)(local_58 != 0);
    }
    lVar5 = local_50;
    if (ppNtkRes != (Aig_Man_t **)0x0) {
      pAVar8 = Aig_ManDupUnsolvedOutputs(pMan,1);
      pAVar3 = Aig_ManScl(pAVar8,1,1,0,-1,-1,0,0);
      *ppNtkRes = pAVar3;
      Aig_ManStop(pAVar8);
      iVar1 = (int)pAVar8;
    }
  }
  if (local_5c != 0) {
    Abc_Print(iVar1,"The total of %d outputs proved SAT and replaced by const 0 in this run.\n");
  }
  if (uVar2 == 0xffffffff) {
    format = "Property UNDECIDED.  ";
  }
  else {
    if (uVar2 == 0) {
      if (pMan->pSeqModel == (Abc_Cex_t *)0x0) {
        uVar9 = 0xffffffff;
      }
      else {
        uVar9 = (ulong)(uint)pMan->pSeqModel->iPo;
      }
      Abc_Print(iVar1,"Output %d of miter \"%s\" was asserted in frame %d.  ",uVar9,pMan->pName,
                (ulong)(uint)iFrame);
      goto LAB_0024c0f7;
    }
    if (uVar2 != 1) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abci/abcDar.c"
                    ,0x9ee,
                    "int Abc_NtkDarBmcInter_int(Aig_Man_t *, Inter_ManParams_t *, Aig_Man_t **)");
    }
    format = "Property proved.  ";
  }
  Abc_Print(iVar1,format);
LAB_0024c0f7:
  Abc_Print(iVar1,"%s =","Time");
  iVar7 = 3;
  iVar1 = clock_gettime(3,(timespec *)&ts);
  if (iVar1 < 0) {
    lVar6 = -1;
  }
  else {
    lVar6 = ts.tv_nsec / 1000 + ts.tv_sec * 1000000;
  }
  Abc_Print(iVar7,"%9.2f sec\n",(double)(lVar6 + lVar5) / 1000000.0);
  return uVar2;
}

Assistant:

int Abc_NtkDarBmcInter_int( Aig_Man_t * pMan, Inter_ManParams_t * pPars, Aig_Man_t ** ppNtkRes )
{
    int RetValue = -1, iFrame;
    abctime clk = Abc_Clock();
    int nTotalProvedSat = 0;
    assert( pMan->nRegs > 0 );
    if ( ppNtkRes )
        *ppNtkRes = NULL;
    if ( pPars->fUseSeparate )
    {
        Aig_Man_t * pTemp, * pAux;
        Aig_Obj_t * pObjPo;
        int i, Counter = 0;
        Saig_ManForEachPo( pMan, pObjPo, i )
        {
            if ( Aig_ObjFanin0(pObjPo) == Aig_ManConst1(pMan) )
                continue;
            if ( pPars->fVerbose )
                Abc_Print( 1, "Solving output %2d (out of %2d):\n", i, Saig_ManPoNum(pMan) );
            pTemp = Aig_ManDupOneOutput( pMan, i, 1 );
            pTemp = Aig_ManScl( pAux = pTemp, 1, 1, 0, -1, -1, 0, 0 );
            Aig_ManStop( pAux );
            if ( Aig_ManRegNum(pTemp) == 0 )
            {
                pTemp->pSeqModel = NULL;
                RetValue = Fra_FraigSat( pTemp, pPars->nBTLimit, 0, 0, 0, 0, 0, 0, 0, 0 ); 
                if ( pTemp->pData )
                    pTemp->pSeqModel = Abc_CexCreate( Aig_ManRegNum(pMan), Saig_ManPiNum(pMan), (int *)pTemp->pData, 0, i, 1 );
//                pNtk->pModel = pTemp->pData, pTemp->pData = NULL;
            }
            else
                RetValue = Inter_ManPerformInterpolation( pTemp, pPars, &iFrame );
            if ( pTemp->pSeqModel )
            {
                if ( pPars->fDropSatOuts )
                {
                    Abc_Print( 1, "Output %d proved SAT in frame %d (replacing by const 0 and continuing...)\n", i, pTemp->pSeqModel->iFrame );
                    Aig_ObjPatchFanin0( pMan, pObjPo, Aig_ManConst0(pMan) );
                    Aig_ManStop( pTemp );
                    nTotalProvedSat++;
                    continue;
                }
                else
                {
                    Abc_Cex_t * pCex;
                    pCex = pMan->pSeqModel = pTemp->pSeqModel; pTemp->pSeqModel = NULL;
                    pCex->iPo = i;
                    Aig_ManStop( pTemp );
                    break;
                }
            }
            // if solved, remove the output
            if ( RetValue == 1 )
            {
                Aig_ObjPatchFanin0( pMan, pObjPo, Aig_ManConst0(pMan) );
//                    Abc_Print( 1, "Output %3d : Solved ", i );
            }
            else
            {
                Counter++;
//                    Abc_Print( 1, "Output %3d : Undec  ", i );
            }
//                Aig_ManPrintStats( pTemp );
            Aig_ManStop( pTemp );
            Abc_Print( 1, "Solving output %3d (out of %3d) using interpolation.\r", i, Saig_ManPoNum(pMan) );
        }
        Aig_ManCleanup( pMan );
        if ( pMan->pSeqModel == NULL )
        {
            Abc_Print( 1, "Interpolation left %d (out of %d) outputs unsolved              \n", Counter, Saig_ManPoNum(pMan) );
            if ( Counter )
                RetValue = -1;
        }
        if ( ppNtkRes )
        {
            pTemp = Aig_ManDupUnsolvedOutputs( pMan, 1 );
            *ppNtkRes = Aig_ManScl( pTemp, 1, 1, 0, -1, -1, 0, 0 );
            Aig_ManStop( pTemp );
        }
    }
    else
    {    
        RetValue = Inter_ManPerformInterpolation( pMan, pPars, &iFrame );
    }
    if ( nTotalProvedSat )
        Abc_Print( 1, "The total of %d outputs proved SAT and replaced by const 0 in this run.\n", nTotalProvedSat );
    if ( RetValue == 1 )
        Abc_Print( 1, "Property proved.  " );
    else if ( RetValue == 0 )
        Abc_Print( 1, "Output %d of miter \"%s\" was asserted in frame %d.  ", pMan->pSeqModel ? pMan->pSeqModel->iPo : -1, pMan->pName, iFrame );
    else if ( RetValue == -1 )
        Abc_Print( 1, "Property UNDECIDED.  " );
    else
        assert( 0 );
ABC_PRT( "Time", Abc_Clock() - clk );
    return RetValue;
}